

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildReg4U
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot R0,RegSlot R1,RegSlot R2,
          RegSlot R3,uint slotIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *opndProtoParent;
  RegOpnd *opndConstructorParent;
  Opnd *opndEnvironment;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x90c,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_004926b6;
    *puVar3 = 0;
  }
  if (newOpcode == InitClass) {
    opndProtoParent = BuildSrcOpnd(this,R3,TyVar);
    opndConstructorParent = BuildSrcOpnd(this,R2,TyVar);
    opndEnvironment = GetEnvironmentOperand(this,offset);
    BuildInitClass(this,offset,R0,R1,&opndProtoParent->super_Opnd,&opndConstructorParent->super_Opnd
                   ,opndEnvironment,slotIndex);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x917,"(false)","Unknown Reg4U opcode");
    if (!bVar2) {
LAB_004926b6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg4U(Js::OpCode newOpcode, uint32 offset, Js::RegSlot R0, Js::RegSlot R1, Js::RegSlot R2, Js::RegSlot R3, uint slotIndex)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    switch (newOpcode)
    {
        case Js::OpCode::InitClass:
        {
            BuildInitClass(offset, R0, R1, BuildSrcOpnd(R3), BuildSrcOpnd(R2), GetEnvironmentOperand(offset), slotIndex);
            break;
        }

        default:
            AssertMsg(false, "Unknown Reg4U opcode");
            break;
    }
}